

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * regex_escape(string *__return_storage_ptr__,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  int iVar1;
  
  if (regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_
                               );
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_,
                 "[.^$|()*+?\\[\\]{}\\\\]",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __first._M_current = (s->_M_dataplus)._M_p;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + s->_M_string_length),
             &regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_,"\\$0",3,0);
  return __return_storage_ptr__;
}

Assistant:

std::string regex_escape(const std::string & s) {
    static const std::regex special_chars("[.^$|()*+?\\[\\]{}\\\\]");
    return std::regex_replace(s, special_chars, "\\$0");
}